

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall JsonnetJsonValue::JsonnetJsonValue(JsonnetJsonValue *this,JsonnetJsonValue *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer puVar5;
  
  this->kind = param_1->kind;
  paVar1 = &(this->string).field_2;
  (this->string)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_1->string)._M_dataplus._M_p;
  paVar2 = &(param_1->string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_1->string).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->string).field_2 + 8) = uVar4;
  }
  else {
    (this->string)._M_dataplus._M_p = pcVar3;
    (this->string).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->string)._M_string_length = (param_1->string)._M_string_length;
  (param_1->string)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->string)._M_string_length = 0;
  (param_1->string).field_2._M_local_buf[0] = '\0';
  this->number = param_1->number;
  puVar5 = (param_1->elements).
           super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->elements).
       super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar5;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->elements).
       super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->fields)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->fields)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

JsonnetJsonValue(JsonnetJsonValue&&) = default;